

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  bool bVar1;
  RGBColorSpace *cs;
  float fVar2;
  anon_class_24_3_48d30edf func;
  undefined1 auVar5 [48];
  undefined1 auVar3 [64];
  undefined8 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  SampledSpectrum SVar12;
  RGB RVar13;
  TextureEvalContext *local_b0;
  Tuple2<pbrt::Vector2,_float> **ppTStack_a8;
  Tuple2<pbrt::Vector2,_float> **local_a0;
  RGB local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Tuple2<pbrt::Vector2,_float> local_70;
  Tuple2<pbrt::Vector2,_float> local_68;
  Tuple2<pbrt::Vector2,_float> *local_60;
  TextureEvalContext local_58;
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  auVar5 = ctx._16_48_;
  local_98._0_8_ = &local_68;
  local_60 = &local_70;
  ppTStack_a8 = (Tuple2<pbrt::Vector2,_float> **)&local_98;
  local_a0 = &local_60;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_b0 = &local_58;
  local_58 = ctx;
  func.dstdx = (Vector2f **)ppTStack_a8;
  func.ctx = local_b0;
  func.dstdy = (Vector2f **)local_a0;
  auVar7._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar7._8_56_ = extraout_var;
  auVar10 = vmovshdup_avx(auVar7._0_16_);
  local_88 = (this->super_ImageTextureBase).scale;
  auVar10 = vinsertps_avx(auVar7._0_16_,ZEXT416((uint)(1.0 - auVar10._0_4_)),0x10);
  uVar8 = auVar10._8_8_;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  RVar13 = MIPMap::Filter<pbrt::RGB>
                     ((this->super_ImageTextureBase).mipmap,(Point2f)auVar10._0_8_,
                      (Vector2f)local_68,(Vector2f)local_70);
  bVar1 = (this->super_ImageTextureBase).invert;
  fVar2 = local_88 * RVar13.b;
  auVar10._0_4_ = local_88 * RVar13.r;
  auVar10._4_4_ = fStack_84 * RVar13.g;
  auVar10._8_4_ = fStack_80 * (float)uVar8;
  auVar10._12_4_ = fStack_7c * (float)((ulong)uVar8 >> 0x20);
  auVar6._8_4_ = 0x3f800000;
  auVar6._0_8_ = 0x3f8000003f800000;
  auVar6._12_4_ = 0x3f800000;
  if (bVar1 != false) {
    auVar10 = vsubps_avx(auVar6,auVar10);
  }
  auVar10 = vmaxps_avx(auVar10,_DAT_00443010);
  auVar4._16_48_ = auVar5;
  auVar4._0_16_ = ZEXT416((uint)fVar2);
  auVar3._4_60_ = auVar4._4_60_;
  auVar3._0_4_ = (uint)(bVar1 & 1) * (int)(1.0 - fVar2) + (uint)!(bool)(bVar1 & 1) * (int)fVar2;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  auVar11 = vmaxss_avx(auVar3._0_16_,auVar11);
  local_b0 = (TextureEvalContext *)vmovlps_avx(auVar10);
  ppTStack_a8 = (Tuple2<pbrt::Vector2,_float> **)CONCAT44(ppTStack_a8._4_4_,auVar11._0_4_);
  cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
  if (cs == (RGBColorSpace *)0x0) {
    uVar9 = auVar10._0_4_;
    SVar12.values.values[2] = (float)uVar9;
    SVar12.values.values[3] = (float)uVar9;
    SVar12.values.values[0] = (float)uVar9;
    SVar12.values.values[1] = (float)uVar9;
  }
  else if (this->spectrumType == Albedo) {
    auVar10 = vminps_avx(auVar6,auVar10);
    auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
    local_98._0_8_ = vmovlps_avx(auVar10);
    local_98.b = auVar6._0_4_;
    RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)&local_58,cs,&local_98);
    SVar12 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_58,&lambda);
  }
  else if (this->spectrumType == Unbounded) {
    RGBUnboundedSpectrum::RGBUnboundedSpectrum
              ((RGBUnboundedSpectrum *)&local_58,cs,(RGB *)&local_b0);
    SVar12 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_58,&lambda);
  }
  else {
    RGBIlluminantSpectrum::RGBIlluminantSpectrum
              ((RGBIlluminantSpectrum *)&local_58,cs,(RGB *)&local_b0);
    SVar12 = RGBIlluminantSpectrum::Sample((RGBIlluminantSpectrum *)&local_58,&lambda);
  }
  return (array<float,_4>)(array<float,_4>)SVar12;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    // Apply texture mapping and flip $t$ coordinate for image texture lookup
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    st[1] = 1 - st[1];

    // Lookup filtered RGB value in _MIPMap_
    RGB rgb = scale * mipmap->Filter<RGB>(st, dstdx, dstdy);
    rgb = ClampZero(invert ? (RGB(1, 1, 1) - rgb) : rgb);

    // Return _SampledSpectrum_ for RGB image texture value
    if (const RGBColorSpace *cs = mipmap->GetRGBColorSpace(); cs != nullptr) {
        if (spectrumType == SpectrumType::Unbounded)
            return RGBUnboundedSpectrum(*cs, rgb).Sample(lambda);
        else if (spectrumType == SpectrumType::Albedo)
            return RGBAlbedoSpectrum(*cs, Clamp(rgb, 0, 1)).Sample(lambda);
        else
            return RGBIlluminantSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    DCHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);

#endif
}